

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void recordFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db;
  u32 serial_type;
  int iVar1;
  undefined1 *z;
  u32 nVal;
  
  serial_type = sqlite3VdbeSerialType(*argv,1,&nVal);
  iVar1 = sqlite3VarintLen((ulong)serial_type);
  db = context->pOut->db;
  iVar1 = iVar1 + 1;
  z = (undefined1 *)sqlite3DbMallocRawNN(db,(long)(int)(nVal + iVar1));
  if (z != (undefined1 *)0x0) {
    *z = (char)iVar1;
    if (serial_type < 0x80) {
      z[1] = (char)serial_type;
    }
    else {
      sqlite3PutVarint(z + 1,(ulong)serial_type);
    }
    sqlite3VdbeSerialPut(z + iVar1,*argv,serial_type);
    sqlite3_result_blob(context,z,nVal + iVar1,(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFreeNN(db,z);
    return;
  }
  sqlite3_result_error_nomem(context);
  return;
}

Assistant:

static void recordFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const int file_format = 1;
  u32 iSerial;                    /* Serial type */
  int nSerial;                    /* Bytes of space for iSerial as varint */
  u32 nVal;                       /* Bytes of space required for argv[0] */
  int nRet;
  sqlite3 *db;
  u8 *aRet;

  UNUSED_PARAMETER( argc );
  iSerial = sqlite3VdbeSerialType(argv[0], file_format, &nVal);
  nSerial = sqlite3VarintLen(iSerial);
  db = sqlite3_context_db_handle(context);

  nRet = 1 + nSerial + nVal;
  aRet = sqlite3DbMallocRawNN(db, nRet);
  if( aRet==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    aRet[0] = nSerial+1;
    putVarint32(&aRet[1], iSerial);
    sqlite3VdbeSerialPut(&aRet[1+nSerial], argv[0], iSerial);
    sqlite3_result_blob(context, aRet, nRet, SQLITE_TRANSIENT);
    sqlite3DbFreeNN(db, aRet);
  }
}